

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall LTAircraft::~LTAircraft(LTAircraft *this)

{
  void *in_RDI;
  LTAircraft *unaff_retaddr;
  
  ~LTAircraft(unaff_retaddr);
  operator_delete(in_RDI,0x958);
  return;
}

Assistant:

LTAircraft::~LTAircraft()
{
    // make sure external view doesn't use this aircraft any longer
    if (IsInCameraView())
        ToggleCameraView();
    
    // Decrease number of visible aircraft and log a message about that fact
    dataRefs.DecNumAc();
    LOG_MSG(logINFO,INFO_AC_REMOVED,labelInternal.c_str());
}